

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall jessilib::config::reload(config *this)

{
  bool bVar1;
  object local_68;
  lock_guard<std::shared_mutex> local_18;
  lock_guard<std::shared_mutex> guard;
  config *this_local;
  
  guard._M_device = &this->m_mutex;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_18,&this->m_mutex);
  bVar1 = std::filesystem::__cxx11::path::empty(&this->m_filename);
  bVar1 = impl::_debug_assert_helper
                    (!bVar1,
                     "Failed assertion: \'!m_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:84"
                    );
  if (bVar1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_format);
    bVar1 = impl::_debug_assert_helper
                      (!bVar1,
                       "Failed assertion: \'!m_format.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:85"
                      );
    if (bVar1) {
      read_object(&local_68,&this->m_filename,&this->m_format,utf_8);
      object::operator=(&this->m_data,&local_68);
      object::~object(&local_68);
    }
  }
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void config::reload() {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	if (jessilib_debug_assert(!m_filename.empty())
		&& jessilib_debug_assert(!m_format.empty())) {
		// Load data from disk
		m_data = read_object(m_filename, m_format);
	}
}